

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O0

bc_error_t *
bc_error_parser(bc_error_type_t type,char *src,size_t src_len,size_t current,char *format,...)

{
  ulong uVar1;
  char in_AL;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_158 [40];
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  bc_error_t *local_a0;
  bc_error_t *rv;
  char *line;
  ulong uStack_88;
  char c;
  size_t i;
  size_t pos;
  size_t lineend;
  size_t linestart;
  size_t lineno;
  char *msg;
  va_list ap;
  char *format_local;
  size_t current_local;
  size_t src_len_local;
  char *src_local;
  bc_error_t *pbStack_10;
  bc_error_type_t type_local;
  
  if (in_AL != '\0') {
    local_128 = in_XMM0_Qa;
    local_118 = in_XMM1_Qa;
    local_108 = in_XMM2_Qa;
    local_f8 = in_XMM3_Qa;
    local_e8 = in_XMM4_Qa;
    local_d8 = in_XMM5_Qa;
    local_c8 = in_XMM6_Qa;
    local_b8 = in_XMM7_Qa;
  }
  local_130 = in_R9;
  if (format == (char *)0x0) {
    pbStack_10 = bc_error_new(type,"");
  }
  else {
    ap[0].overflow_arg_area = local_158;
    ap[0]._0_8_ = &stack0x00000008;
    msg._4_4_ = 0x30;
    msg._0_4_ = 0x28;
    lineno = (size_t)bc_strdup_vprintf(format,(__va_list_tag *)&msg);
    linestart = 1;
    lineend = 0;
    pos = 0;
    i = 1;
    for (uStack_88 = 0; uStack_88 < src_len; uStack_88 = uStack_88 + 1) {
      line._7_1_ = src[uStack_88];
      uVar1 = uStack_88;
      if (uStack_88 < current) {
        if ((uStack_88 + 1 < src_len) &&
           (((line._7_1_ == '\n' && (src[uStack_88 + 1] == '\r')) ||
            ((line._7_1_ == '\r' && (src[uStack_88 + 1] == '\n')))))) {
          linestart = linestart + 1;
          i = 1;
          uVar1 = uStack_88 + 1;
          if (uStack_88 + 2 < src_len) {
            lineend = uStack_88 + 2;
          }
        }
        else if ((line._7_1_ == '\n') || (line._7_1_ == '\r')) {
          linestart = linestart + 1;
          i = 1;
          if (uStack_88 + 1 < src_len) {
            lineend = uStack_88 + 1;
          }
        }
        else {
          i = i + 1;
        }
      }
      else if ((line._7_1_ == '\n') || (line._7_1_ == '\r')) {
        pos = uStack_88;
        break;
      }
      uStack_88 = uVar1;
    }
    if ((pos <= lineend) && (lineend <= src_len)) {
      pos = src_len;
    }
    rv = (bc_error_t *)bc_strndup(src + lineend,pos - lineend);
    local_a0 = (bc_error_t *)0x0;
    if (*(char *)&rv->msg == '\0') {
      local_a0 = bc_error_new(type,(char *)lineno);
    }
    else {
      local_a0 = bc_error_new_printf(type,"%s\nError occurred near line %d, position %d: %s",lineno,
                                     linestart,i,rv);
    }
    free((void *)lineno);
    free(rv);
    pbStack_10 = local_a0;
  }
  return pbStack_10;
}

Assistant:

bc_error_t*
bc_error_parser(bc_error_type_t type, const char *src, size_t src_len,
    size_t current, const char *format, ...)
{
    if (format == NULL)
        return bc_error_new(type, "");
    va_list ap;
    va_start(ap, format);
    char *msg = bc_strdup_vprintf(format, ap);
    va_end(ap);

    size_t lineno = 1;
    size_t linestart = 0;
    size_t lineend = 0;
    size_t pos = 1;

    for (size_t i = 0; i < src_len; i++) {
        char c = src[i];
        if (i < current) {
            if ((i + 1) < src_len) {
                if ((c == '\n' && src[i + 1] == '\r') ||
                    (c == '\r' && src[i + 1] == '\n'))
                {
                    lineno++;
                    i++;
                    pos = 1;
                    if ((i + 1) < src_len)
                        linestart = i + 1;
                    continue;
                }
            }
            if (c == '\n' || c == '\r') {
                lineno++;
                pos = 1;
                if ((i + 1) < src_len)
                    linestart = i + 1;
                continue;
            }
            pos++;
        }
        else if (c == '\n' || c == '\r') {
            lineend = i;
            break;
        }
    }

    if (lineend <= linestart && src_len >= linestart)
        lineend = src_len;

    char *line = bc_strndup(src + linestart, lineend - linestart);

    bc_error_t *rv = NULL;

    if (line[0] == '\0')  // "near" message isn't useful if line is empty
        rv = bc_error_new(type, msg);
    else
        rv = bc_error_new_printf(type,
            "%s\nError occurred near line %d, position %d: %s", msg, lineno,
            pos, line);

    free(msg);
    free(line);

    return rv;
}